

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
* detail::operator|(vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper<char32_t,_true,_false,_false> *info)

{
  pointer pbVar1;
  size_type sVar2;
  long lVar3;
  long lVar4;
  size_type __n;
  size_type local_40;
  unsigned_long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = 0;
  while( true ) {
    sVar2 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::find
                      (str,info->delim,local_40);
    if (sVar2 == 0xffffffffffffffff) break;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(__return_storage_ptr__->
                  super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    lVar3 = lVar4 >> 5;
    if ((ulong)((long)(__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pbVar1 >> 5) <
        lVar3 + 1U) {
      __n = lVar4 >> 4;
      if (lVar3 < 0) {
        __n = 0xffffffffffffffff;
      }
      std::
      vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
      ::reserve(__return_storage_ptr__,__n);
    }
    local_38 = sVar2 - local_40;
    std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
    emplace_back<std::__cxx11::u32string&,unsigned_long&,unsigned_long>
              ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
               __return_storage_ptr__,str,&local_40,&local_38);
    local_40 = sVar2 + 1;
  }
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            (str,0,local_40);
  std::vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>>::
  emplace_back<std::__cxx11::u32string>
            ((vector<std::__cxx11::u32string,std::allocator<std::__cxx11::u32string>> *)
             __return_storage_ptr__,str);
  return __return_storage_ptr__;
}

Assistant:

vector<b_str<CharType>> operator| (b_str<CharType>&& str, const split_helper<CharType, true, false, false>& info)
	{
		vector<b_str<CharType>> re;
		size_t current = 0;
		for (size_t found; (found = str.find_first_of(info.delim, current)) != b_str<CharType>::npos; current = found + 1) {
			if (re.capacity() < re.size() + 1) re.reserve((std::numeric_limits<size_t>::max() / 2 < re.size()) ? std::numeric_limits<size_t>::max() : re.size() * 2);
			re.emplace_back(str, current, found - current);
		}
		str.erase(0, current);
		re.emplace_back(std::move(str));
		return re;
	}